

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O2

int ccm_auth_crypt(mbedtls_ccm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,
                  uchar *add,size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  size_t input_len;
  int iVar1;
  size_t local_60;
  size_t olen;
  uchar *local_50;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  
  local_48 = tag;
  olen = length;
  local_50 = add;
  iVar1 = mbedtls_ccm_starts(ctx,mode,iv,iv_len);
  input_len = olen;
  if (iVar1 == 0) {
    local_38 = input;
    local_40 = output;
    iVar1 = mbedtls_ccm_set_lengths(ctx,add_len,olen,tag_len);
    if (iVar1 == 0) {
      iVar1 = mbedtls_ccm_update_ad(ctx,local_50,add_len);
      if (iVar1 == 0) {
        iVar1 = mbedtls_ccm_update(ctx,local_38,input_len,local_40,input_len,&local_60);
        if (iVar1 == 0) {
          iVar1 = mbedtls_ccm_finish(ctx,local_48,tag_len);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int ccm_auth_crypt(mbedtls_ccm_context *ctx, int mode, size_t length,
                          const unsigned char *iv, size_t iv_len,
                          const unsigned char *add, size_t add_len,
                          const unsigned char *input, unsigned char *output,
                          unsigned char *tag, size_t tag_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen;

    if ((ret = mbedtls_ccm_starts(ctx, mode, iv, iv_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_set_lengths(ctx, add_len, length, tag_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_update_ad(ctx, add, add_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_update(ctx, input, length,
                                  output, length, &olen)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_finish(ctx, tag, tag_len)) != 0) {
        return ret;
    }

    return 0;
}